

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void scale_patch_internal(double alpha,int ndim,double *patch1,int *lo1,int *hi1,int *dims1)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int *dims;
  int iVar6;
  long lVar7;
  int subscr1 [7];
  
  uVar2 = 0;
  uVar5 = 0;
  if (0 < ndim) {
    uVar5 = (ulong)(uint)ndim;
  }
  iVar6 = 1;
  while( true ) {
    if (uVar5 == uVar2) {
      iVar4 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      lVar7 = 0;
      dims = dims1;
      for (; iVar6 != iVar4; iVar4 = iVar4 + 1) {
        iVar1 = Index(ndim,subscr1,dims1);
        if (iVar4 == 0) {
          lVar7 = (long)iVar1;
        }
        lVar3 = iVar1 - lVar7;
        patch1[lVar3] = patch1[lVar3] * alpha;
        update_subscript(ndim,subscr1,lo1,hi1,dims);
      }
      return;
    }
    iVar4 = hi1[uVar2] - lo1[uVar2];
    if (dims1[uVar2] <= iVar4) break;
    iVar6 = iVar6 * (iVar4 + 1);
    subscr1[uVar2] = lo1[uVar2];
    uVar2 = uVar2 + 1;
  }
  __assert_fail("diff < dims1[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x13a,"void scale_patch_internal(double, int, double *, int *, int *, int *)");
}

Assistant:

void scale_patch_internal(double alpha, int ndim, double *patch1, 
                 int lo1[], int hi1[], int dims1[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM];
    Integer idx1, offset1=0;

    for(i=0;i<ndim;i++){   /* count # of elements in patch */
        int diff = hi1[i]-lo1[i];
        assert(diff < dims1[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
    }

    /* scale element values in both patches */ 
    for(j=0; j< elems; j++){ 
        
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    

        if(j==0){
            offset1 =idx1;
        }
        idx1 -= offset1;

        patch1[idx1] *= alpha;
        update_subscript(ndim, subscr1, lo1,hi1, dims1);
    }    
}